

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TracerFactory.cpp
# Opt level: O0

expected<std::shared_ptr<opentracing::v3::Tracer>,_std::error_code> * __thiscall
jaegertracing::TracerFactory::MakeTracer
          (expected<std::shared_ptr<opentracing::v3::Tracer>,_std::error_code>
           *__return_storage_ptr__,TracerFactory *this,char *configuration,string *errorMessage)

{
  ulong uVar1;
  unexpected_type<std::error_code> uVar2;
  bad_alloc *anon_var_0;
  exception *e;
  unexpected_type<std::error_code> local_248;
  undefined1 local_238 [8];
  Config tracerConfig;
  ParserException *e_1;
  undefined1 local_48 [8];
  Node yaml;
  string *errorMessage_local;
  char *configuration_local;
  TracerFactory *this_local;
  
  yaml.m_pNode = (node *)errorMessage;
  YAML::Node::Node((Node *)local_48);
  YAML::Load((char *)&e_1);
  YAML::Node::operator=((Node *)local_48,(Node *)&e_1);
  YAML::Node::~Node((Node *)&e_1);
  Config::parse((Config *)local_238,(Node *)local_48);
  if ((this->_readFromEnv & 1U) != 0) {
    Config::fromEnv((Config *)local_238);
  }
  Config::serviceName_abi_cxx11_((Config *)local_238);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    Tracer::make((Tracer *)&e,(Config *)local_238);
    opentracing::v3::expected<std::shared_ptr<opentracing::v3::Tracer>,_std::error_code>::
    expected<true,_0>(__return_storage_ptr__,(value_type *)&e);
    std::shared_ptr<opentracing::v3::Tracer>::~shared_ptr((shared_ptr<opentracing::v3::Tracer> *)&e)
    ;
  }
  else {
    std::__cxx11::string::operator=((string *)yaml.m_pNode,"`service_name` not provided");
    uVar2 = opentracing::v3::make_unexpected<std::error_code_const&>
                      ((error_code *)opentracing::v3::invalid_configuration_error);
    local_248.m_error._M_cat = uVar2.m_error._M_cat;
    local_248.m_error._M_value = uVar2.m_error._M_value;
    opentracing::v3::expected<std::shared_ptr<opentracing::v3::Tracer>,_std::error_code>::
    expected<true,_0>(__return_storage_ptr__,&local_248);
  }
  tracerConfig._baggageRestrictions._refreshInterval.__r._4_4_ = 1;
  Config::~Config((Config *)local_238);
  YAML::Node::~Node((Node *)local_48);
  return __return_storage_ptr__;
}

Assistant:

opentracing::expected<std::shared_ptr<opentracing::Tracer>>
TracerFactory::MakeTracer(const char* configuration,
                          std::string& errorMessage) const noexcept try {
#ifndef JAEGERTRACING_WITH_YAML_CPP
    errorMessage =
        "Failed to construct tracer: Jaeger was not build with yaml support.";
    return opentracing::make_unexpected(
        std::make_error_code(std::errc::not_supported));
#else
    YAML::Node yaml;
    try {
        yaml = YAML::Load(configuration);
    } catch (const YAML::ParserException& e) {
        errorMessage = e.what();
        return opentracing::make_unexpected(
            opentracing::configuration_parse_error);
    }

    auto tracerConfig = jaegertracing::Config::parse(yaml);

    if (_readFromEnv) {
        tracerConfig.fromEnv();
    }

    if (tracerConfig.serviceName().empty()) {
        errorMessage = "`service_name` not provided";
        return opentracing::make_unexpected(
            opentracing::invalid_configuration_error);
    }

    return jaegertracing::Tracer::make(tracerConfig);
#endif  // JAEGERTRACING_WITH_YAML_CPP
} catch (const std::bad_alloc&) {
    return opentracing::make_unexpected(
        std::make_error_code(std::errc::not_enough_memory));
} catch (const std::exception& e) {
    errorMessage = e.what();
    return opentracing::make_unexpected(
        opentracing::invalid_configuration_error);
}